

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O0

void pzgeom::TPZQuadraticLine::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  TPZFMatrix<Fad<double>_> *this;
  Fad<double> *fadexpr;
  Fad<double> *pFVar1;
  TPZVec<Fad<double>_> *in_RDI;
  Fad<double> qsi;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *in_stack_fffffffffffffe40;
  Fad<double> *in_stack_fffffffffffffe48;
  Fad<double> *in_stack_fffffffffffffe50;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  *in_stack_fffffffffffffe58;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffe60;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *w;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *in_stack_fffffffffffffe78;
  Fad<double> *in_stack_fffffffffffffe80;
  double in_stack_fffffffffffffe88;
  double in_stack_fffffffffffffe90;
  Fad<double> *in_stack_fffffffffffffe98;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_38;
  
  TPZVec<Fad<double>_>::operator[](in_RDI,0);
  w = &local_38;
  Fad<double>::Fad(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  Fad<double>::operator-(in_stack_fffffffffffffe48);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  operator*<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadUnaryMin<Fad<double>_>_> *)in_stack_fffffffffffffe78,w);
  operator/<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  TPZFMatrix<Fad<double>_>::operator()
            (in_stack_fffffffffffffe60,(int64_t)in_stack_fffffffffffffe58,
             (int64_t)in_stack_fffffffffffffe50);
  Fad<double>::operator=
            ((Fad<double> *)in_stack_fffffffffffffe60,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffffe58);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffffe40);
  FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffffe40);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffffe40);
  FadExpr<FadUnaryMin<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryMin<Fad<double>_>_> *)0x182b0b9);
  Fad<double>::operator+(in_stack_fffffffffffffe48);
  operator+<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  operator*<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadUnaryPlus<Fad<double>_>_> *)in_stack_fffffffffffffe78,
             (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)w);
  operator/<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_double,_nullptr>
            ((FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  this = (TPZFMatrix<Fad<double>_> *)
         TPZFMatrix<Fad<double>_>::operator()
                   (in_stack_fffffffffffffe60,(int64_t)in_stack_fffffffffffffe58,
                    (int64_t)in_stack_fffffffffffffe50);
  Fad<double>::operator=((Fad<double> *)this,in_stack_fffffffffffffe58);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
              *)in_stack_fffffffffffffe40);
  FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffffe40);
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe40);
  FadExpr<FadUnaryPlus<Fad<double>_>_>::~FadExpr((FadExpr<FadUnaryPlus<Fad<double>_>_> *)0x182b192);
  operator-<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  operator+<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  operator*<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_nullptr>
            (in_stack_fffffffffffffe78,(FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)w);
  fadexpr = TPZFMatrix<Fad<double>_>::operator()
                      (this,(int64_t)in_stack_fffffffffffffe58,(int64_t)in_stack_fffffffffffffe50);
  Fad<double>::operator=
            ((Fad<double> *)this,
             (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
              *)fadexpr);
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
              *)in_stack_fffffffffffffe40);
  FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffe40);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>::~FadExpr(in_stack_fffffffffffffe40);
  operator-<Fad<double>,_double,_nullptr>(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()
                     (this,(int64_t)fadexpr,(int64_t)in_stack_fffffffffffffe50);
  Fad<double>::operator=
            ((Fad<double> *)this,(FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)fadexpr);
  FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffe40);
  operator+<Fad<double>,_double,_nullptr>(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)fadexpr,(int64_t)pFVar1);
  Fad<double>::operator=
            ((Fad<double> *)this,(FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)fadexpr);
  FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryAdd<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffe40);
  operator*<double,_Fad<double>,_nullptr>(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(this,(int64_t)fadexpr,(int64_t)pFVar1);
  Fad<double>::operator=
            ((Fad<double> *)this,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)fadexpr);
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)pFVar1);
  Fad<double>::~Fad(pFVar1);
  return;
}

Assistant:

void TPZQuadraticLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = loc[0];
    
    phi(0,0)  = -qsi*(1.-qsi)/2.;
    phi(1,0)  = +qsi*(1.+qsi)/2.;
    phi(2,0)  = (1.-qsi)*(1.+qsi);
    
    dphi(0,0) = qsi-0.5;
    dphi(0,1) = qsi+0.5;
    dphi(0,2) = -2.*qsi;
}